

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O0

FT_Error tt_face_load_sbit_image
                   (TT_Face face,FT_ULong strike_index,FT_UInt glyph_index,FT_UInt load_flags,
                   FT_Stream stream,FT_Bitmap *map,TT_SBit_MetricsRec *metrics)

{
  FT_Library library_00;
  FT_Slot_Internal pFVar1;
  FT_Library library;
  FT_Bitmap new_map;
  TT_SBitDecoderRec decoder [1];
  int local_34;
  FT_Error error;
  FT_Bitmap *map_local;
  FT_Stream stream_local;
  FT_UInt load_flags_local;
  FT_UInt glyph_index_local;
  FT_ULong strike_index_local;
  TT_Face face_local;
  
  if (face->sbit_table_type - TT_SBIT_TABLE_TYPE_EBLC < 2) {
    local_34 = tt_sbit_decoder_init((TT_SBitDecoder)&new_map.palette,face,strike_index,metrics);
    if (local_34 == 0) {
      local_34 = tt_sbit_decoder_load_image
                           ((TT_SBitDecoder)&new_map.palette,glyph_index,0,0,0,
                            (load_flags & 0x400000) != 0);
      tt_sbit_decoder_done((TT_SBitDecoder)&new_map.palette);
    }
  }
  else if (face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX) {
    local_34 = tt_face_load_sbix_image
                         (face,strike_index,glyph_index,stream,map,metrics,
                          (load_flags & 0x400000) != 0);
  }
  else {
    local_34 = 2;
  }
  if ((((local_34 == 0) && ((load_flags & 0x100000) == 0)) && ((load_flags & 0x400000) == 0)) &&
     (map->pixel_mode == '\a')) {
    library_00 = ((face->root).glyph)->library;
    FT_Bitmap_Init((FT_Bitmap *)&library);
    local_34 = FT_Bitmap_Convert(library_00,map,(FT_Bitmap *)&library,1);
    if (local_34 == 0) {
      map->pixel_mode = new_map.buffer._2_1_;
      map->pitch = new_map.rows;
      map->num_grays = (unsigned_short)new_map.buffer;
      ft_glyphslot_set_bitmap((face->root).glyph,(FT_Byte *)new_map._8_8_);
      pFVar1 = ((face->root).glyph)->internal;
      pFVar1->flags = pFVar1->flags | 1;
    }
    else {
      FT_Bitmap_Done(library_00,(FT_Bitmap *)&library);
    }
  }
  return local_34;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_sbit_image( TT_Face              face,
                           FT_ULong             strike_index,
                           FT_UInt              glyph_index,
                           FT_UInt              load_flags,
                           FT_Stream            stream,
                           FT_Bitmap           *map,
                           TT_SBit_MetricsRec  *metrics )
  {
    FT_Error  error = FT_Err_Ok;


    switch ( (FT_UInt)face->sbit_table_type )
    {
    case TT_SBIT_TABLE_TYPE_EBLC:
    case TT_SBIT_TABLE_TYPE_CBLC:
      {
        TT_SBitDecoderRec  decoder[1];


        error = tt_sbit_decoder_init( decoder, face, strike_index, metrics );
        if ( !error )
        {
          error = tt_sbit_decoder_load_image(
                    decoder,
                    glyph_index,
                    0,
                    0,
                    0,
                    ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
          tt_sbit_decoder_done( decoder );
        }
      }
      break;

    case TT_SBIT_TABLE_TYPE_SBIX:
      error = tt_face_load_sbix_image(
                face,
                strike_index,
                glyph_index,
                stream,
                map,
                metrics,
                ( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) != 0 );
      break;

    default:
      error = FT_THROW( Unknown_File_Format );
      break;
    }

    /* Flatten color bitmaps if color was not requested. */
    if ( !error                                        &&
         !( load_flags & FT_LOAD_COLOR )               &&
         !( load_flags & FT_LOAD_BITMAP_METRICS_ONLY ) &&
         map->pixel_mode == FT_PIXEL_MODE_BGRA         )
    {
      FT_Bitmap   new_map;
      FT_Library  library = face->root.glyph->library;


      FT_Bitmap_Init( &new_map );

      /* Convert to 8bit grayscale. */
      error = FT_Bitmap_Convert( library, map, &new_map, 1 );
      if ( error )
        FT_Bitmap_Done( library, &new_map );
      else
      {
        map->pixel_mode = new_map.pixel_mode;
        map->pitch      = new_map.pitch;
        map->num_grays  = new_map.num_grays;

        ft_glyphslot_set_bitmap( face->root.glyph, new_map.buffer );
        face->root.glyph->internal->flags |= FT_GLYPH_OWN_BITMAP;
      }
    }

    return error;
  }